

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::maybe_connect_web_seeds(torrent *this)

{
  iterator iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  time_point32 tVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Self __tmp;
  iterator web;
  
  if ((((((this->super_torrent_hot_members).field_0x4b & 4) == 0) &&
       ((this->m_web_seeds).
        super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>.
        _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->m_web_seeds)) &&
      (bVar2 = is_finished(this), !bVar2)) &&
     (((this->field_0x5c0 & 8) != 0 &&
      (iVar3 = num_peers(this),
      iVar3 < (int)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >>
                          0x21) & 0xffffff))))) {
    iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x1e])();
    iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x2e])();
    iVar4 = session_settings::get_int((session_settings *)CONCAT44(extraout_var,iVar4),0x4055);
    if (iVar3 < iVar4) {
      iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x2e])();
      iVar4 = session_settings::get_int((session_settings *)CONCAT44(extraout_var_00,iVar3),0x4083);
      iVar3 = 100;
      if (0 < iVar4) {
        iVar3 = iVar4;
      }
      tVar5 = time_now32();
      iVar1._M_node =
           (this->m_web_seeds).
           super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      while ((web._M_node = iVar1._M_node, web._M_node != (_List_node_base *)&this->m_web_seeds &&
             (0 < iVar3))) {
        iVar1._M_node = (web._M_node)->_M_next;
        if ((*(char *)((long)&web._M_node[0xb]._M_next + 6) == '\0') &&
           ((((*(char *)((long)&web._M_node[0xb]._M_next + 2) == '\0' &&
              (*(int *)((long)&web._M_node[6]._M_prev + 4) <= (int)tVar5.__d.__r)) &&
             (*(char *)((long)&web._M_node[0xb]._M_next + 3) == '\x01')) &&
            ((iVar3 = iVar3 + -1, web._M_node[9]._M_next == (_List_node_base *)0x0 &&
             (*(char *)((long)&web._M_node[0xb]._M_next + 1) == '\0')))))) {
          connect_to_url_seed(this,web);
        }
      }
    }
  }
  return;
}

Assistant:

void torrent::maybe_connect_web_seeds()
	{
		if (m_abort) return;

		// if we have everything we want we don't need to connect to any web-seed
		if (m_web_seeds.empty()
			|| is_finished()
			|| !m_files_checked
			|| num_peers() >= int(m_max_connections)
			|| m_ses.num_connections() >= settings().get_int(settings_pack::connections_limit))
		{
			return;
		}

		// when set to unlimited, use 100 as the limit
		int limit = zero_or(settings().get_int(settings_pack::max_web_seed_connections)
			, 100);

		auto const now = aux::time_now32();

		// keep trying web-seeds if there are any
		// first find out which web seeds we are connected to
		for (auto i = m_web_seeds.begin(); i != m_web_seeds.end() && limit > 0;)
		{
			auto const w = i++;
			if (w->disabled || w->removed || w->retry > now || !w->interesting)
				continue;

			--limit;
			if (w->peer_info.connection || w->resolving)
				continue;

			connect_to_url_seed(w);
		}
	}